

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void move_item_forward(c2m_ctx_t c2m_ctx,MIR_item_t item)

{
  gen_ctx_conflict *pgVar1;
  MIR_item_t pMVar2;
  gen_ctx_t_conflict gen_ctx;
  MIR_item_t item_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  if (pgVar1->curr_func == (MIR_item_t)0x0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  pMVar2 = DLIST_MIR_item_t_tail(&pgVar1->curr_func->module->items);
  if (pMVar2 == item) {
    DLIST_MIR_item_t_remove(&pgVar1->curr_func->module->items,item);
    DLIST_MIR_item_t_insert_before(&pgVar1->curr_func->module->items,pgVar1->curr_func,item);
  }
  return;
}

Assistant:

static void move_item_forward (c2m_ctx_t c2m_ctx, MIR_item_t item) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;

  assert (curr_func != NULL);
  if (DLIST_TAIL (MIR_item_t, curr_func->module->items) != item) return;
  DLIST_REMOVE (MIR_item_t, curr_func->module->items, item);
  DLIST_INSERT_BEFORE (MIR_item_t, curr_func->module->items, curr_func, item);
}